

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::FieldGenerator
          (FieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  Type TVar4;
  int iVar5;
  mapped_type *pmVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  Descriptor *descriptor_00;
  FieldDescriptor *field;
  AlphaNum *a;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  AlphaNum local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator local_1a9;
  key_type local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  field_flags;
  key_type local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string raw_field_name;
  string camel_case_name;
  key_type local_c8;
  string un_camel_case_name;
  SourceLocation location;
  
  this->_vptr_FieldGenerator = (_func_int **)&PTR__SingleFieldGenerator_0047b2e0;
  this->descriptor_ = descriptor;
  this_00 = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FieldName_abi_cxx11_(&camel_case_name,(objectivec *)descriptor,(FieldDescriptor *)options);
  raw_field_name._M_dataplus._M_p = (pointer)&raw_field_name.field_2;
  raw_field_name._M_string_length = 0;
  raw_field_name.field_2._M_local_buf[0] = '\0';
  TVar4 = FieldDescriptor::type(descriptor);
  if (TVar4 == TYPE_GROUP) {
    FieldDescriptor::message_type(descriptor);
  }
  std::__cxx11::string::_M_assign((string *)&raw_field_name);
  UnCamelCaseFieldName(&un_camel_case_name,&camel_case_name,descriptor);
  bVar2 = std::operator!=(&raw_field_name,&un_camel_case_name);
  location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
  location.leading_comments._M_string_length = 0;
  location.leading_comments.field_2._M_local_buf[0] = '\0';
  paVar7 = &location.trailing_comments.field_2;
  location.trailing_comments._M_string_length = 0;
  location.trailing_comments.field_2._M_local_buf[0] = '\0';
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  location.trailing_comments._M_dataplus._M_p = (pointer)paVar7;
  bVar3 = FieldDescriptor::GetSourceLocation(descriptor,&location);
  if (bVar3) {
    BuildCommentsString_abi_cxx11_
              ((string *)&local_200,(objectivec *)&location,(SourceLocation *)0x1,SUB81(paVar7,0));
    std::__cxx11::string::string((string *)&local_168,"comments",(allocator *)&local_148);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_168);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_168);
  }
  else {
    std::__cxx11::string::string((string *)&local_200,"comments",(allocator *)&local_168);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&local_200);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  std::__cxx11::string::~string((string *)&local_200);
  ClassName_abi_cxx11_(&local_168,*(objectivec **)(descriptor + 0x50),descriptor_00);
  std::__cxx11::string::string((string *)&local_200,"classname",(allocator *)&local_148);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_200);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string((string *)&local_200,"name",(allocator *)&local_148);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_200);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&local_200);
  FieldNameCapitalized_abi_cxx11_(&local_148,(objectivec *)descriptor,field);
  std::__cxx11::string::string((string *)&local_200,"capitalized_name",(allocator *)&local_1d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_200);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string((string *)&local_200,"raw_field_name",(allocator *)&local_1d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_200);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&local_200);
  std::operator+(&local_1d0,&local_168,"_FieldNumber_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200,
                 &local_1d0,&local_148);
  std::__cxx11::string::string((string *)&local_1a8,"field_number_name",(allocator *)&local_128);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1a8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d0);
  strings::AlphaNum::AlphaNum(&local_200,*(int *)(descriptor + 0x44));
  StrCat_abi_cxx11_(&local_1d0,(protobuf *)&local_200,a);
  std::__cxx11::string::string((string *)&local_1a8,"field_number",(allocator *)&local_128);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1a8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1d0);
  GetCapitalizedType_abi_cxx11_((string *)&local_200,(objectivec *)descriptor,field_00);
  std::__cxx11::string::string((string *)&local_1d0,"field_type",(allocator *)&local_1a8);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_200);
  GetOptionalDeprecatedAttribute<google::protobuf::FieldDescriptor>
            ((string *)&local_200,descriptor,(FileDescriptor *)0x0,true,false);
  std::__cxx11::string::string((string *)&local_1d0,"deprecated_attribute",(allocator *)&local_1a8);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_200);
  field_flags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  field_flags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  field_flags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar5 = *(int *)(descriptor + 0x3c);
  if (iVar5 == 3) {
    std::__cxx11::string::string((string *)&local_200,"GPBFieldRepeated",(allocator *)&local_1d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    iVar5 = *(int *)(descriptor + 0x3c);
  }
  if (iVar5 == 2) {
    std::__cxx11::string::string((string *)&local_200,"GPBFieldRequired",(allocator *)&local_1d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    iVar5 = *(int *)(descriptor + 0x3c);
  }
  if (iVar5 == 1) {
    std::__cxx11::string::string((string *)&local_200,"GPBFieldOptional",(allocator *)&local_1d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  bVar3 = FieldDescriptor::is_packed(descriptor);
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_200,"GPBFieldPacked",(allocator *)&local_1d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  if (descriptor[0x40] == (FieldDescriptor)0x1) {
    std::__cxx11::string::string
              ((string *)&local_200,"GPBFieldHasDefaultValue",(allocator *)&local_1d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)&local_200,"GPBFieldTextFormatNameCustom",(allocator *)&local_1d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  TVar4 = FieldDescriptor::type(descriptor);
  if (TVar4 == TYPE_ENUM) {
    std::__cxx11::string::string
              ((string *)&local_200,"GPBFieldHasEnumDescriptor",(allocator *)&local_1d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  BuildFlagsString((string *)&local_200,FLAGTYPE_FIELD,&field_flags);
  std::__cxx11::string::string((string *)&local_1d0,"fieldflags",(allocator *)&local_1a8);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_200);
  DefaultValue_abi_cxx11_((string *)&local_200,(objectivec *)descriptor,field_01);
  std::__cxx11::string::string((string *)&local_1d0,"default",(allocator *)&local_1a8);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_200);
  GPBGenericValueFieldName_abi_cxx11_((string *)&local_200,(objectivec *)descriptor,field_02);
  std::__cxx11::string::string((string *)&local_1d0,"default_name",(allocator *)&local_1a8);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string((string *)&local_200,"dataTypeSpecific_name",(allocator *)&local_1d0)
  ;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_200);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string
            ((string *)&local_200,"dataTypeSpecific_value",(allocator *)&local_1d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_200);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&local_200);
  std::operator+(&local_128,"(uint32_t)offsetof(",&local_168);
  std::operator+(&local_1a8,&local_128,"__storage_, ");
  std::operator+(&local_1d0,&local_1a8,&camel_case_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200,
                 &local_1d0,")");
  std::__cxx11::string::string((string *)&local_c8,"storage_offset_value",&local_1a9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string
            ((string *)&local_200,"storage_offset_comment",(allocator *)&local_1d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_200);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string((string *)&local_200,"storage_attribute",(allocator *)&local_1d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_200);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&local_200);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&field_flags);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  SourceLocation::~SourceLocation(&location);
  std::__cxx11::string::~string((string *)&un_camel_case_name);
  std::__cxx11::string::~string((string *)&raw_field_name);
  std::__cxx11::string::~string((string *)&camel_case_name);
  return;
}

Assistant:

FieldGenerator::FieldGenerator(const FieldDescriptor* descriptor,
                               const Options& options)
    : descriptor_(descriptor) {
  SetCommonFieldVariables(descriptor, &variables_);
}